

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_IsDenormal(void)

{
  uint64_t bits;
  uint64_t min_double64;
  undefined1 in_stack_ffffffffffffffdf;
  Double in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  int iVar1;
  Double in_stack_fffffffffffffff0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  double_conversion::Double::Double((Double *)&stack0xfffffffffffffff0,1);
  double_conversion::Double::IsDenormal((Double *)in_stack_ffffffffffffffe0.d64_);
  CheckHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,(char *)in_stack_ffffffffffffffe0.d64_,
              (bool)in_stack_ffffffffffffffdf);
  iVar1 = 0xfffff;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffe0,0xfffffffffffff);
  double_conversion::Double::IsDenormal((Double *)in_stack_ffffffffffffffe0.d64_);
  CheckHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,(char *)in_stack_ffffffffffffffe0.d64_,
              (bool)in_stack_ffffffffffffffdf);
  iVar1 = 0x100000;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffd8,0x10000000000000);
  double_conversion::Double::IsDenormal((Double *)in_stack_ffffffffffffffe0.d64_);
  CheckHelper((char *)in_stack_fffffffffffffff0.d64_,iVar1,(char *)in_stack_ffffffffffffffe0.d64_,
              (bool)in_stack_ffffffffffffffdf);
  return;
}

Assistant:

TEST(Double_IsDenormal) {
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(Double(min_double64).IsDenormal());
  uint64_t bits = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  CHECK(Double(bits).IsDenormal());
  bits = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  CHECK(!Double(bits).IsDenormal());
}